

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  bool bVar1;
  equal_to<const_slang::ast::ValueSymbol_*> *peVar2;
  raw_key_type *__y;
  pointer ppVar3;
  raw_key_type *__y_00;
  pointer ppVar4;
  ValueSymbol *in_RSI;
  FlowAnalysisBase *in_RDI;
  const_iterator it_1;
  LValueSymbol *symbolState;
  const_iterator it;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  const_iterator *in_stack_fffffffffffffb88;
  undefined6 in_stack_fffffffffffffb90;
  undefined1 in_stack_fffffffffffffb96;
  undefined1 in_stack_fffffffffffffb97;
  IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *in_stack_fffffffffffffb98;
  IntervalMap<unsigned_long,_std::monostate,_3U> *this_00;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  byte bVar5;
  ValueSymbol *in_stack_fffffffffffffc08;
  ValueSymbol **ppVVar6;
  DataFlowAnalysis *in_stack_fffffffffffffc10;
  char *pcVar7;
  ValueSymbol *local_320;
  char_pointer local_318;
  Type *in_stack_fffffffffffffcf0;
  EvalContext *in_stack_fffffffffffffcf8;
  Expression *in_stack_fffffffffffffd00;
  ValueSymbol *local_250;
  char_pointer local_248;
  table_element_pointer local_240;
  ValueSymbol *local_218;
  bool local_201;
  ValueSymbol **local_200;
  char *local_1f8;
  char_pointer local_1f0;
  table_element_pointer local_1e8;
  ValueSymbol **local_1e0;
  char *local_1d8;
  char_pointer local_1d0;
  table_element_pointer local_1c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_1c0;
  ValueSymbol **local_1b0;
  char *local_1a8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_1a0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
  local_190;
  ValueSymbol **local_178;
  char *local_170;
  iterator local_168;
  size_t local_158;
  ValueSymbol **local_150;
  char *local_148;
  uint local_13c;
  value_type *local_138;
  value_type *local_130;
  uint local_124;
  group_type *local_120;
  size_t local_118;
  pow2_quadratic_prober local_110;
  size_t local_100;
  size_t local_f8;
  ValueSymbol **local_f0;
  char *local_e8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_e0;
  ValueSymbol **local_d0;
  char *local_c8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_c0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
  local_b0;
  ValueSymbol **local_98;
  char *local_90;
  iterator local_88;
  size_t local_78;
  ValueSymbol **local_70;
  char *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  ValueSymbol **local_10;
  char *local_8;
  
  local_218 = in_RSI;
  FlowAnalysisBase::getEvalContext(in_RDI);
  ast::ValueSymbol::getType((ValueSymbol *)0x61cb39);
  ast::ValueDriver::getBounds
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x61cb66);
  if (bVar1) {
    pcVar7 = in_RDI[2].evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x48;
    local_250 = local_218;
    local_200 = &local_250;
    local_1f8 = pcVar7;
    local_1b0 = local_200;
    local_1a8 = pcVar7;
    local_178 = local_200;
    local_170 = pcVar7;
    local_150 = local_200;
    local_148 = pcVar7;
    local_158 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                ::hash_for<slang::ast::ValueSymbol_const*>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                            *)CONCAT17(in_stack_fffffffffffffb97,
                                       CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)
                                      ),(ValueSymbol **)in_stack_fffffffffffffb88);
    ppVVar6 = local_150;
    local_f8 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                               *)CONCAT17(in_stack_fffffffffffffb97,
                                          CONCAT16(in_stack_fffffffffffffb96,
                                                   in_stack_fffffffffffffb90)),
                              (size_t)in_stack_fffffffffffffb88);
    local_100 = local_158;
    local_f0 = ppVVar6;
    local_e8 = pcVar7;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_110,local_f8)
    ;
    do {
      local_118 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_110);
      local_120 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                  ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                            *)0x61ccee);
      local_120 = local_120 + local_118;
      local_124 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffffb98,
                             CONCAT17(in_stack_fffffffffffffb97,
                                      CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90))
                            );
      if (local_124 != 0) {
        local_130 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                    ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                                *)0x61cd40);
        local_138 = local_130 + local_118 * 0xf;
        do {
          local_13c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          peVar2 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                           *)0x61cd93);
          ppVVar6 = local_f0;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,unsigned_int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>,64ul,16ul>>
                ::key_from<std::pair<slang::ast::ValueSymbol_const*const,unsigned_int>>
                          ((pair<const_slang::ast::ValueSymbol_*const,_unsigned_int> *)0x61cdc0);
          bVar1 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()(peVar2,ppVVar6,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
            ::table_locator(&local_190,local_120,local_13c,local_138 + local_13c);
            goto LAB_0061ceb7;
          }
          local_124 = local_124 - 1 & local_124;
        } while (local_124 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_fffffffffffffb97,
                                           CONCAT16(in_stack_fffffffffffffb96,
                                                    in_stack_fffffffffffffb90)),
                                  (size_t)in_stack_fffffffffffffb88);
      if (bVar1) {
        memset(&local_190,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
        ::table_locator(&local_190);
        goto LAB_0061ceb7;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_110,*(size_t *)(pcVar7 + 0x10));
    } while (bVar1);
    memset(&local_190,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>_>
    ::table_locator(&local_190);
LAB_0061ceb7:
    local_168 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
                ::make_iterator((locator *)0x61cec4);
    local_1c0.pc_ = local_168.pc_;
    local_1c0.p_ = local_168.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_1a0,&local_1c0);
    local_1f0 = local_1a0.pc_;
    local_1e8 = local_1a0.p_;
    local_248 = local_1a0.pc_;
    local_240 = local_1a0.p_;
    boost::unordered::
    unordered_flat_map<const_slang::ast::ValueSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
    ::end((unordered_flat_map<const_slang::ast::ValueSymbol_*,_unsigned_int,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_unsigned_int>,_64UL,_16UL>_>
           *)0x61cf61);
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)CONCAT17(in_stack_fffffffffffffb97,
                                   CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)),
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffb88);
    if (bVar1) {
      ppVar3 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_unsigned_int>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)CONCAT17(in_stack_fffffffffffffb97,
                                        CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90
                                                )));
      SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>::operator[]
                ((SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol> *)
                 (in_RDI[2].evalContext.diags.super_SmallVector<slang::Diagnostic,_2UL>.stackBase +
                 0x10),(ulong)ppVar3->second);
      std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x61cfe4);
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                (in_stack_fffffffffffffb98,
                 (pair<unsigned_long,_unsigned_long> *)
                 CONCAT17(in_stack_fffffffffffffb97,
                          CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)));
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end
                ((IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U> *)
                 CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8));
      bVar1 = IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
              operator==((overlap_iterator *)
                         CONCAT17(in_stack_fffffffffffffb97,
                                  CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)),
                         in_stack_fffffffffffffb88);
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::const_iterator::
      ~const_iterator((const_iterator *)0x61d046);
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::overlap_iterator::
      ~overlap_iterator((overlap_iterator *)0x61d053);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return true;
      }
    }
    pcVar7 = in_RDI[3].evalContext.stack.stackBase + 0x10;
    local_320 = local_218;
    local_1e0 = &local_320;
    local_1d8 = pcVar7;
    local_d0 = local_1e0;
    local_c8 = pcVar7;
    local_98 = local_1e0;
    local_90 = pcVar7;
    local_70 = local_1e0;
    local_68 = pcVar7;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
               ::hash_for<slang::ast::ValueSymbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                           *)CONCAT17(in_stack_fffffffffffffb97,
                                      CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90))
                          ,(ValueSymbol **)in_stack_fffffffffffffb88);
    ppVVar6 = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                               *)CONCAT17(in_stack_fffffffffffffb97,
                                          CONCAT16(in_stack_fffffffffffffb96,
                                                   in_stack_fffffffffffffb90)),
                              (size_t)in_stack_fffffffffffffb88);
    local_10 = ppVVar6;
    local_20 = local_78;
    local_8 = pcVar7;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                           *)0x61d20c);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffb98,
                            CONCAT17(in_stack_fffffffffffffb97,
                                     CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)))
      ;
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                               *)0x61d25b);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          peVar2 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                   ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                           *)0x61d2ab);
          ppVVar6 = local_10;
          __y_00 = boost::unordered::detail::foa::
                   table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
                   ::
                   key_from<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>>
                             ((pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                               *)0x61d2d8);
          bVar1 = std::equal_to<const_slang::ast::ValueSymbol_*>::operator()(peVar2,ppVVar6,__y_00);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_0061d3cc;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_fffffffffffffb97,
                                           CONCAT16(in_stack_fffffffffffffb96,
                                                    in_stack_fffffffffffffb90)),
                                  (size_t)in_stack_fffffffffffffb88);
      if (bVar1) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
        ::table_locator(&local_b0);
        goto LAB_0061d3cc;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,*(size_t *)(in_RDI[3].evalContext.stack.stackBase + 0x20));
    } while (bVar1);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>_>
    ::table_locator(&local_b0);
LAB_0061d3cc:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
               ::make_iterator((locator *)0x61d3d9);
    local_e0.pc_ = local_88.pc_;
    local_e0.p_ = local_88.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_c0,&local_e0);
    local_1d0 = local_c0.pc_;
    local_1c8 = local_c0.p_;
    local_318 = local_c0.pc_;
    boost::unordered::
    unordered_flat_map<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
    ::end((unordered_flat_map<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
           *)0x61d479);
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)CONCAT17(in_stack_fffffffffffffb97,
                                   CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)),
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffffb88);
    bVar5 = 0;
    if (bVar1) {
      ppVar4 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)CONCAT17(in_stack_fffffffffffffb97,
                                        CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90
                                                )));
      this_00 = &ppVar4->second;
      std::optional<std::pair<unsigned_long,_unsigned_long>_>::operator*
                ((optional<std::pair<unsigned_long,_unsigned_long>_> *)0x61d4e8);
      IntervalMap<unsigned_long,_std::monostate,_3U>::find
                (this_00,(pair<unsigned_long,_unsigned_long> *)
                         CONCAT17(in_stack_fffffffffffffb97,
                                  CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)));
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
      ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                    *)CONCAT17(in_stack_fffffffffffffb97,
                               CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)));
      IntervalMap<unsigned_long,_std::monostate,_3U>::end
                ((IntervalMap<unsigned_long,_std::monostate,_3U> *)
                 CONCAT17(bVar5,in_stack_fffffffffffffba8));
      bVar1 = IntervalMap<unsigned_long,_std::monostate,_3U>::overlap_iterator::operator==
                        ((overlap_iterator *)
                         CONCAT17(in_stack_fffffffffffffb97,
                                  CONCAT16(in_stack_fffffffffffffb96,in_stack_fffffffffffffb90)),
                         (const_iterator *)in_stack_fffffffffffffb88);
      bVar5 = bVar1 ^ 0xff;
      IntervalMap<unsigned_long,_std::monostate,_3U>::const_iterator::~const_iterator
                ((const_iterator *)0x61d573);
      IntervalMap<unsigned_long,_std::monostate,_3U>::overlap_iterator::~overlap_iterator
                ((overlap_iterator *)0x61d58c);
    }
    if ((bVar5 & 1) == 0) {
      local_201 = false;
    }
    else {
      local_201 = true;
    }
  }
  else {
    local_201 = isReferenced(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  }
  return local_201;
}

Assistant:

bool DataFlowAnalysis::isReferenced(const ValueSymbol& symbol, const Expression& lsp) const {
    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds)
        return isReferenced(symbol);

    {
        auto it = symbolToSlot.find(&symbol);
        if (it != symbolToSlot.end()) {
            auto& symbolState = lvalues[it->second];
            if (symbolState.assigned.find(*bounds) != symbolState.assigned.end())
                return true;
        }
    }
    {
        auto it = rvalues.find(&symbol);
        if (it != rvalues.end() && it->second.find(*bounds) != it->second.end())
            return true;
    }

    return false;
}